

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# staj_event.hpp
# Opt level: O0

void __thiscall
jsoncons::basic_staj_event<char>::send_json_event
          (basic_staj_event<char> *this,basic_json_visitor<char> *visitor,ser_context *context,
          error_code *ec)

{
  staj_event_type sVar1;
  basic_json_visitor<char> *in_RSI;
  basic_staj_event<char> *in_RDI;
  error_code *in_stack_ffffffffffffff18;
  basic_json_visitor<char> *in_stack_ffffffffffffff20;
  undefined8 in_stack_ffffffffffffff28;
  semantic_tag sVar2;
  basic_json_visitor<char> *in_stack_ffffffffffffff30;
  undefined7 in_stack_ffffffffffffff60;
  undefined1 in_stack_ffffffffffffff67;
  undefined1 uVar3;
  string_view_type *in_stack_ffffffffffffff68;
  basic_json_visitor<char> *in_stack_ffffffffffffff70;
  string_view_type *in_stack_ffffffffffffff78;
  basic_json_visitor<char> *in_stack_ffffffffffffff80;
  type_conflict tVar4;
  ser_context *in_stack_ffffffffffffff88;
  undefined8 in_stack_ffffffffffffff90;
  semantic_tag tag;
  byte_string_view *in_stack_ffffffffffffff98;
  byte_string_view local_50;
  basic_string_view<char,_std::char_traits<char>_> local_40;
  basic_string_view<char,_std::char_traits<char>_> local_30 [2];
  basic_json_visitor<char> *local_10;
  
  tag = (semantic_tag)((ulong)in_stack_ffffffffffffff90 >> 0x38);
  sVar2 = (semantic_tag)((ulong)in_stack_ffffffffffffff28 >> 0x38);
  local_10 = in_RSI;
  sVar1 = event_type(in_RDI);
  switch(sVar1) {
  case key:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (local_30,(in_RDI->value_).string_data_,in_RDI->length_);
    basic_json_visitor<char>::key
              (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
               (ser_context *)CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60));
    break;
  case string_value:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_40,(in_RDI->value_).string_data_,in_RDI->length_);
    sVar2 = (semantic_tag)((ulong)in_stack_ffffffffffffff70 >> 0x38);
    basic_staj_event<char>::tag(in_RDI);
    basic_json_visitor<char>::string_value
              (local_10,in_stack_ffffffffffffff78,sVar2,(ser_context *)in_stack_ffffffffffffff68);
    break;
  case byte_string_value:
    byte_string_view::byte_string_view(&local_50,(in_RDI->value_).byte_string_data_,in_RDI->length_)
    ;
    tVar4 = (type_conflict)((ulong)in_stack_ffffffffffffff80 >> 0x20);
    basic_staj_event<char>::tag(in_RDI);
    basic_json_visitor<char>::byte_string_value<jsoncons::byte_string_view>
              ((basic_json_visitor<char> *)in_RDI,in_stack_ffffffffffffff98,tag,
               in_stack_ffffffffffffff88,tVar4);
    break;
  case null_value:
    basic_staj_event<char>::tag(in_RDI);
    basic_json_visitor<char>::null_value
              (local_10,(semantic_tag)((ulong)in_stack_ffffffffffffff68 >> 0x38),
               (ser_context *)CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60));
    break;
  case bool_value:
    uVar3 = (in_RDI->value_).bool_value_;
    basic_staj_event<char>::tag(in_RDI);
    basic_json_visitor<char>::bool_value
              (in_stack_ffffffffffffff70,SUB81((ulong)local_10 >> 0x38,0),
               (semantic_tag)((ulong)local_10 >> 0x30),
               (ser_context *)CONCAT17(uVar3,in_stack_ffffffffffffff60));
    break;
  case int64_value:
    basic_staj_event<char>::tag(in_RDI);
    basic_json_visitor<char>::int64_value
              (in_stack_ffffffffffffff80,(int64_t)in_stack_ffffffffffffff78,
               (semantic_tag)((ulong)in_stack_ffffffffffffff70 >> 0x38),
               (ser_context *)in_stack_ffffffffffffff68);
    break;
  case uint64_value:
    basic_staj_event<char>::tag(in_RDI);
    basic_json_visitor<char>::uint64_value
              (in_stack_ffffffffffffff80,(uint64_t)in_stack_ffffffffffffff78,
               (semantic_tag)((ulong)in_stack_ffffffffffffff70 >> 0x38),
               (ser_context *)in_stack_ffffffffffffff68);
    break;
  case end_object:
    basic_json_visitor<char>::end_object
              (in_stack_ffffffffffffff20,(ser_context *)in_stack_ffffffffffffff18,
               (error_code *)0x1ec9b4);
    break;
  case half_value:
    basic_staj_event<char>::tag(in_RDI);
    basic_json_visitor<char>::half_value
              (in_stack_ffffffffffffff70,(uint16_t)((ulong)in_stack_ffffffffffffff68 >> 0x30),
               (semantic_tag)((ulong)in_stack_ffffffffffffff68 >> 0x28),
               (ser_context *)CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60));
    break;
  case double_value:
    basic_staj_event<char>::tag(in_RDI);
    basic_json_visitor<char>::double_value
              (in_stack_ffffffffffffff80,(double)in_stack_ffffffffffffff78,
               (semantic_tag)((ulong)in_stack_ffffffffffffff70 >> 0x38),
               (ser_context *)in_stack_ffffffffffffff68);
    break;
  default:
    break;
  case begin_object:
    basic_staj_event<char>::tag(in_RDI);
    basic_json_visitor<char>::begin_object
              (in_stack_ffffffffffffff30,sVar2,(ser_context *)in_stack_ffffffffffffff20,
               in_stack_ffffffffffffff18);
    break;
  case begin_array:
    basic_staj_event<char>::tag(in_RDI);
    basic_json_visitor<char>::begin_array
              (in_stack_ffffffffffffff70,(semantic_tag)((ulong)in_stack_ffffffffffffff68 >> 0x38),
               (ser_context *)CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60));
    break;
  case end_array:
    basic_json_visitor<char>::end_array
              (in_stack_ffffffffffffff70,(ser_context *)in_stack_ffffffffffffff68);
  }
  return;
}

Assistant:

void send_json_event(basic_json_visitor<CharT>& visitor,
        const ser_context& context,
        std::error_code& ec) const
    {
        switch (event_type())
        {
            case staj_event_type::begin_array:
                visitor.begin_array(tag(), context);
                break;
            case staj_event_type::end_array:
                visitor.end_array(context);
                break;
            case staj_event_type::begin_object:
                visitor.begin_object(tag(), context, ec);
                break;
            case staj_event_type::end_object:
                visitor.end_object(context, ec);
                break;
            case staj_event_type::key:
                visitor.key(string_view_type(value_.string_data_,length_), context);
                break;
            case staj_event_type::string_value:
                visitor.string_value(string_view_type(value_.string_data_,length_), tag(), context);
                break;
            case staj_event_type::byte_string_value:
                visitor.byte_string_value(byte_string_view(value_.byte_string_data_,length_), tag(), context);
                break;
            case staj_event_type::null_value:
                visitor.null_value(tag(), context);
                break;
            case staj_event_type::bool_value:
                visitor.bool_value(value_.bool_value_, tag(), context);
                break;
            case staj_event_type::int64_value:
                visitor.int64_value(value_.int64_value_, tag(), context);
                break;
            case staj_event_type::uint64_value:
                visitor.uint64_value(value_.uint64_value_, tag(), context);
                break;
            case staj_event_type::half_value:
                visitor.half_value(value_.half_value_, tag(), context);
                break;
            case staj_event_type::double_value:
                visitor.double_value(value_.double_value_, tag(), context);
                break;
            default:
                break;
        }
    }